

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O2

ON_2dPoint __thiscall ON_SubDFaceParameter::QuadFaceParameters(ON_SubDFaceParameter *this)

{
  ushort uVar1;
  ON_2dPoint OVar2;
  bool bVar3;
  double in_XMM1_Qa;
  ON_2dPoint OVar4;
  
  bVar3 = IsSet(this);
  if (bVar3) {
    uVar1 = (this->m_cdex).m_corner_index;
    if (uVar1 < 4 && (this->m_cdex).m_edge_count == 4) {
      OVar4.x = (double)(*(code *)(&DAT_006cb7f4 + *(int *)(&DAT_006cb7f4 + (ulong)uVar1 * 4)))();
      OVar4.y = in_XMM1_Qa;
      return OVar4;
    }
  }
  OVar2.y = ON_2dPoint::NanPoint.y;
  OVar2.x = ON_2dPoint::NanPoint.x;
  return OVar2;
}

Assistant:

const ON_2dPoint ON_SubDFaceParameter::QuadFaceParameters() const
{
  if (IsSet() && m_cdex.IsQuadFace())
  {
    switch (m_cdex.CornerIndex())
    {
    case 0:
      return ON_2dPoint(m_s, m_t);
      break;
    case 1:
      return ON_2dPoint(1.0 - m_t, m_s);
      break;
    case 2:
      return ON_2dPoint(1.0 - m_s, 1.0 - m_t);
      break;
    case 3:
      return ON_2dPoint(m_t, 1.0 - m_s);
      break;
    }
  }
  return ON_2dPoint::NanPoint;
}